

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XGLLoader.cpp
# Opt level: O0

bool __thiscall Assimp::XGLImporter::ReadMesh(XGLImporter *this,TempScope *scope)

{
  size_t this_00;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  mapped_type *pmVar3;
  element_type *peVar4;
  undefined4 extraout_var_01;
  mapped_type *pmVar5;
  char *closetag;
  mapped_type *this_01;
  reference __p;
  aiVector3D aVar6;
  byte local_442;
  byte local_441;
  TempFace *local_408;
  undefined4 local_3f8;
  pair<unsigned_int,_aiMesh_*> local_320;
  aiMesh *local_310;
  aiMesh *m;
  TempMaterialMesh TStack_300;
  aiMesh **local_298;
  pairt *p;
  iterator __end1;
  iterator __begin1;
  map<unsigned_int,_Assimp::XGLImporter::TempMaterialMesh,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Assimp::XGLImporter::TempMaterialMesh>_>_>
  *__range1;
  uint i_1;
  TempMaterialMesh *mesh;
  uint meshId;
  uint local_240;
  byte local_23b;
  byte local_23a;
  allocator<char> local_239;
  uint i;
  bool uv;
  bool nor;
  string local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1f8;
  string *s_1;
  undefined1 local_1e8 [5];
  bool has [3];
  TempFace tf [3];
  uint mid;
  uint vcount;
  float fStack_16c;
  uint local_168;
  float local_164;
  int id_2;
  float local_158;
  undefined8 local_150;
  float local_148;
  float local_140;
  key_type local_13c;
  int id_1;
  float local_130;
  undefined8 local_128;
  float local_120;
  key_type local_11c;
  undefined1 local_118 [4];
  int id;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_f8;
  string *s;
  uint local_dc;
  undefined1 local_d8 [4];
  uint mesh_id;
  map<unsigned_int,_Assimp::XGLImporter::TempMaterialMesh,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Assimp::XGLImporter::TempMaterialMesh>_>_>
  bymat;
  TempMesh t;
  TempScope *scope_local;
  XGLImporter *this_local;
  
  t.uvs._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)scope;
  TempMesh::TempMesh((TempMesh *)&bymat._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  map<unsigned_int,_Assimp::XGLImporter::TempMaterialMesh,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Assimp::XGLImporter::TempMaterialMesh>_>_>
  ::map((map<unsigned_int,_Assimp::XGLImporter::TempMaterialMesh,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Assimp::XGLImporter::TempMaterialMesh>_>_>
         *)local_d8);
  local_dc = ReadIDAttr(this);
  while (bVar1 = ReadElementUpToClosing(this,"mesh"), bVar1) {
    GetElementName_abi_cxx11_((string *)local_118,this);
    local_f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118;
    bVar1 = std::operator==(local_f8,"mat");
    if (bVar1) {
      ReadMaterial(this,(TempScope *)t.uvs._M_t._M_impl.super__Rb_tree_header._M_node_count);
    }
    else {
      bVar1 = std::operator==(local_f8,"p");
      if (bVar1) {
        peVar4 = std::
                 __shared_ptr_access<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&this->m_reader);
        iVar2 = (*peVar4->_vptr_IIrrXMLReader[7])(peVar4,"ID");
        if (CONCAT44(extraout_var,iVar2) == 0) {
          LogFunctions<Assimp::XGLImporter>::LogWarn("no ID attribute on <p>, ignoring");
        }
        else {
          peVar4 = std::
                   __shared_ptr_access<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&this->m_reader);
          local_11c = (*peVar4->_vptr_IIrrXMLReader[9])(peVar4,"ID");
          aVar6 = ReadVec3(this);
          local_130 = aVar6.z;
          _id_1 = aVar6._0_8_;
          local_13c = local_11c;
          local_128 = _id_1;
          local_120 = local_130;
          pmVar3 = std::
                   map<unsigned_int,_aiVector3t<float>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_aiVector3t<float>_>_>_>
                   ::operator[]((map<unsigned_int,_aiVector3t<float>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_aiVector3t<float>_>_>_>
                                 *)&bymat._M_t._M_impl.super__Rb_tree_header._M_node_count,
                                &local_13c);
          pmVar3->x = (float)(undefined4)local_128;
          pmVar3->y = (float)local_128._4_4_;
          pmVar3->z = local_120;
        }
      }
      else {
        bVar1 = std::operator==(local_f8,"n");
        if (bVar1) {
          peVar4 = std::
                   __shared_ptr_access<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&this->m_reader);
          iVar2 = (*peVar4->_vptr_IIrrXMLReader[7])(peVar4,"ID");
          if (CONCAT44(extraout_var_00,iVar2) == 0) {
            LogFunctions<Assimp::XGLImporter>::LogWarn("no ID attribute on <n>, ignoring");
          }
          else {
            peVar4 = std::
                     __shared_ptr_access<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)&this->m_reader);
            local_140 = (float)(*peVar4->_vptr_IIrrXMLReader[9])(peVar4,"ID");
            aVar6 = ReadVec3(this);
            local_158 = aVar6.z;
            _id_2 = aVar6._0_8_;
            local_164 = local_140;
            local_150 = _id_2;
            local_148 = local_158;
            pmVar3 = std::
                     map<unsigned_int,_aiVector3t<float>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_aiVector3t<float>_>_>_>
                     ::operator[]((map<unsigned_int,_aiVector3t<float>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_aiVector3t<float>_>_>_>
                                   *)&t.points._M_t._M_impl.super__Rb_tree_header._M_node_count,
                                  (key_type *)&local_164);
            pmVar3->x = (float)(undefined4)local_150;
            pmVar3->y = (float)local_150._4_4_;
            pmVar3->z = local_148;
          }
        }
        else {
          bVar1 = std::operator==(local_f8,"tc");
          if (bVar1) {
            peVar4 = std::
                     __shared_ptr_access<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)&this->m_reader);
            iVar2 = (*peVar4->_vptr_IIrrXMLReader[7])(peVar4,"ID");
            if (CONCAT44(extraout_var_01,iVar2) == 0) {
              LogFunctions<Assimp::XGLImporter>::LogWarn("no ID attribute on <tc>, ignoring");
            }
            else {
              peVar4 = std::
                       __shared_ptr_access<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)&this->m_reader);
              local_168 = (*peVar4->_vptr_IIrrXMLReader[9])(peVar4,"ID");
              _vcount = ReadVec2(this);
              mid = local_168;
              pmVar5 = std::
                       map<unsigned_int,_aiVector2t<float>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_aiVector2t<float>_>_>_>
                       ::operator[]((map<unsigned_int,_aiVector2t<float>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_aiVector2t<float>_>_>_>
                                     *)&t.normals._M_t._M_impl.super__Rb_tree_header._M_node_count,
                                    &mid);
              pmVar5->x = (float)vcount;
              pmVar5->y = fStack_16c;
            }
          }
          else {
            bVar1 = std::operator==(local_f8,"f");
            if (((bVar1) || (bVar1 = std::operator==(local_f8,"l"), bVar1)) ||
               (bVar1 = std::operator==(local_f8,"p"), bVar1)) {
              bVar1 = std::operator==(local_f8,"f");
              if (bVar1) {
                local_3f8._0_1_ = true;
                local_3f8._1_1_ = false;
                local_3f8._2_2_ = 0;
              }
              else {
                bVar1 = std::operator==(local_f8,"l");
                local_3f8._0_1_ = true;
                local_3f8._1_1_ = false;
                local_3f8._2_2_ = 0;
                if (bVar1) {
                  local_3f8._0_1_ = true;
                  local_3f8._1_1_ = false;
                  local_3f8._2_2_ = 0;
                }
              }
              tf[2].has_uv = local_3f8._0_1_;
              tf[2].has_normal = local_3f8._1_1_;
              tf[2]._34_2_ = local_3f8._2_2_;
              tf[2].uv.y = -NAN;
              local_408 = (TempFace *)local_1e8;
              do {
                TempFace::TempFace(local_408);
                local_408 = local_408 + 1;
              } while (local_408 != (TempFace *)&tf[2].uv.y);
              memset((void *)((long)&s_1 + 5),0,3);
              while( true ) {
                closetag = (char *)std::__cxx11::string::c_str();
                bVar1 = ReadElementUpToClosing(this,closetag);
                if (!bVar1) break;
                GetElementName_abi_cxx11_(&local_218,this);
                local_1f8 = &local_218;
                bVar1 = std::operator==(local_1f8,"fv1");
                if (((bVar1) || (bVar1 = std::operator==(local_1f8,"lv1"), bVar1)) ||
                   (bVar1 = std::operator==(local_1f8,"pv1"), bVar1)) {
                  ReadFaceVertex(this,(TempMesh *)
                                      &bymat._M_t._M_impl.super__Rb_tree_header._M_node_count,
                                 (TempFace *)local_1e8);
                  s_1._5_1_ = 1;
                }
                else {
                  bVar1 = std::operator==(local_1f8,"fv2");
                  if ((bVar1) || (bVar1 = std::operator==(local_1f8,"lv2"), bVar1)) {
                    ReadFaceVertex(this,(TempMesh *)
                                        &bymat._M_t._M_impl.super__Rb_tree_header._M_node_count,
                                   (TempFace *)&tf[0].uv.y);
                    s_1._6_1_ = 1;
                  }
                  else {
                    bVar1 = std::operator==(local_1f8,"fv3");
                    if (bVar1) {
                      ReadFaceVertex(this,(TempMesh *)
                                          &bymat._M_t._M_impl.super__Rb_tree_header._M_node_count,
                                     (TempFace *)&tf[1].uv.y);
                      s_1._7_1_ = 1;
                    }
                    else {
                      bVar1 = std::operator==(local_1f8,"mat");
                      if (bVar1) {
                        if (tf[2].uv.y != -NAN) {
                          LogFunctions<Assimp::XGLImporter>::LogWarn
                                    ("only one material tag allowed per <f>");
                        }
                        tf[2].uv.y = (float)ResolveMaterialRef(this,(TempScope *)
                                                                    t.uvs._M_t._M_impl.
                                                                    super__Rb_tree_header.
                                                                    _M_node_count);
                      }
                      else {
                        bVar1 = std::operator==(local_1f8,"matref");
                        if (bVar1) {
                          if (tf[2].uv.y != -NAN) {
                            LogFunctions<Assimp::XGLImporter>::LogWarn
                                      ("only one material tag allowed per <f>");
                          }
                          tf[2].uv.y = (float)ResolveMaterialRef(this,(TempScope *)
                                                                      t.uvs._M_t._M_impl.
                                                                      super__Rb_tree_header.
                                                                      _M_node_count);
                        }
                      }
                    }
                  }
                }
                std::__cxx11::string::~string((string *)&local_218);
              }
              if (tf[2].uv.y == -NAN) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&i,"missing material index",&local_239);
                LogFunctions<Assimp::XGLImporter>::ThrowException((string *)&i);
                std::__cxx11::string::~string((string *)&i);
                std::allocator<char>::~allocator(&local_239);
              }
              local_23a = 0;
              local_23b = 0;
              for (local_240 = 0; local_240 < (uint)tf[2]._32_4_; local_240 = local_240 + 1) {
                if ((local_1e8[(ulong)local_240 - 3] & 1) == 0) {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&meshId,"missing face vertex data",
                             (allocator<char> *)((long)&mesh + 7));
                  LogFunctions<Assimp::XGLImporter>::ThrowException((string *)&meshId);
                  std::__cxx11::string::~string((string *)&meshId);
                  std::allocator<char>::~allocator((allocator<char> *)((long)&mesh + 7));
                }
                local_441 = 1;
                if ((local_23a & 1) == 0) {
                  local_441 = *(byte *)((long)&tf[local_240].uv.x + 1);
                }
                local_23a = local_441 & 1;
                local_442 = 1;
                if ((local_23b & 1) == 0) {
                  local_442 = *(byte *)&tf[local_240].uv.x;
                }
                local_23b = local_442 & 1;
              }
              if (0x3fffffff < (uint)tf[2].uv.y) {
                LogFunctions<Assimp::XGLImporter>::LogWarn
                          ("material indices exhausted, this may cause errors in the output");
              }
              mesh._0_4_ = (uint)tf[2].uv.y | (uint)local_23a << 0x1f | (local_23b & 1) << 0x1e;
              this_01 = std::
                        map<unsigned_int,_Assimp::XGLImporter::TempMaterialMesh,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Assimp::XGLImporter::TempMaterialMesh>_>_>
                        ::operator[]((map<unsigned_int,_Assimp::XGLImporter::TempMaterialMesh,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Assimp::XGLImporter::TempMaterialMesh>_>_>
                                      *)local_d8,(key_type *)&mesh);
              this_01->matid = (uint)tf[2].uv.y;
              for (__range1._4_4_ = 0; __range1._4_4_ < (uint)tf[2]._32_4_;
                  __range1._4_4_ = __range1._4_4_ + 1) {
                std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
                          (&this_01->positions,
                           (value_type *)(local_1e8 + (ulong)__range1._4_4_ * 0x24));
                if ((local_23a & 1) != 0) {
                  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
                            (&this_01->normals,(value_type *)&tf[__range1._4_4_].pos.y);
                }
                if ((local_23b & 1) != 0) {
                  std::vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>::push_back
                            (&this_01->uvs,(value_type *)&tf[__range1._4_4_].normal.y);
                }
                this_01->pflags = 1 << (SUB41(tf[2]._32_4_,0) - 1U & 0x1f) | this_01->pflags;
              }
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                        (&this_01->vcounts,(value_type_conflict1 *)&tf[2].has_uv);
            }
          }
        }
      }
    }
    std::__cxx11::string::~string((string *)local_118);
  }
  __end1 = std::
           map<unsigned_int,_Assimp::XGLImporter::TempMaterialMesh,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Assimp::XGLImporter::TempMaterialMesh>_>_>
           ::begin((map<unsigned_int,_Assimp::XGLImporter::TempMaterialMesh,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Assimp::XGLImporter::TempMaterialMesh>_>_>
                    *)local_d8);
  p = (pairt *)std::
               map<unsigned_int,_Assimp::XGLImporter::TempMaterialMesh,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Assimp::XGLImporter::TempMaterialMesh>_>_>
               ::end((map<unsigned_int,_Assimp::XGLImporter::TempMaterialMesh,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Assimp::XGLImporter::TempMaterialMesh>_>_>
                      *)local_d8);
  while (bVar1 = std::operator!=(&__end1,(_Self *)&p), bVar1) {
    __p = std::
          _Rb_tree_iterator<std::pair<const_unsigned_int,_Assimp::XGLImporter::TempMaterialMesh>_>::
          operator*(&__end1);
    std::pair<unsigned_int,_Assimp::XGLImporter::TempMaterialMesh>::
    pair<const_unsigned_int,_Assimp::XGLImporter::TempMaterialMesh,_true>
              ((pair<unsigned_int,_Assimp::XGLImporter::TempMaterialMesh> *)&m,__p);
    local_298 = &m;
    local_310 = ToOutputMesh(this,&TStack_300);
    std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::push_back
              ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)
               (t.uvs._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x60),&local_310);
    this_00 = t.uvs._M_t._M_impl.super__Rb_tree_header._M_node_count;
    if (local_dc != 0xffffffff) {
      std::pair<unsigned_int,_aiMesh_*>::pair<unsigned_int,_aiMesh_*,_true>
                (&local_320,&local_dc,&local_310);
      std::
      multimap<unsigned_int,aiMesh*,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,aiMesh*>>>
      ::insert<std::pair<unsigned_int,aiMesh*>>
                ((multimap<unsigned_int,aiMesh*,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,aiMesh*>>>
                  *)this_00,&local_320);
    }
    std::pair<unsigned_int,_Assimp::XGLImporter::TempMaterialMesh>::~pair
              ((pair<unsigned_int,_Assimp::XGLImporter::TempMaterialMesh> *)&m);
    std::_Rb_tree_iterator<std::pair<const_unsigned_int,_Assimp::XGLImporter::TempMaterialMesh>_>::
    operator++(&__end1);
  }
  bVar1 = local_dc == 0xffffffff;
  std::
  map<unsigned_int,_Assimp::XGLImporter::TempMaterialMesh,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Assimp::XGLImporter::TempMaterialMesh>_>_>
  ::~map((map<unsigned_int,_Assimp::XGLImporter::TempMaterialMesh,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Assimp::XGLImporter::TempMaterialMesh>_>_>
          *)local_d8);
  TempMesh::~TempMesh((TempMesh *)&bymat._M_t._M_impl.super__Rb_tree_header._M_node_count);
  return bVar1;
}

Assistant:

bool XGLImporter::ReadMesh(TempScope& scope)
{
    TempMesh t;

    std::map<unsigned int, TempMaterialMesh> bymat;
    const unsigned int mesh_id = ReadIDAttr();

    while (ReadElementUpToClosing("mesh"))  {
        const std::string& s = GetElementName();

        if (s == "mat") {
            ReadMaterial(scope);
        }
        else if (s == "p") {
            if (!m_reader->getAttributeValue("ID")) {
                LogWarn("no ID attribute on <p>, ignoring");
            }
            else {
                int id = m_reader->getAttributeValueAsInt("ID");
                t.points[id] = ReadVec3();
            }
        }
        else if (s == "n") {
            if (!m_reader->getAttributeValue("ID")) {
                LogWarn("no ID attribute on <n>, ignoring");
            }
            else {
                int id = m_reader->getAttributeValueAsInt("ID");
                t.normals[id] = ReadVec3();
            }
        }
        else if (s == "tc") {
            if (!m_reader->getAttributeValue("ID")) {
                LogWarn("no ID attribute on <tc>, ignoring");
            }
            else {
                int id = m_reader->getAttributeValueAsInt("ID");
                t.uvs[id] = ReadVec2();
            }
        }
        else if (s == "f" || s == "l" || s == "p") {
            const unsigned int vcount = s == "f" ? 3 : (s == "l" ? 2 : 1);

            unsigned int mid = ~0u;
            TempFace tf[3];
            bool has[3] = {0};

            while (ReadElementUpToClosing(s.c_str()))   {
                const std::string& s = GetElementName();
                if (s == "fv1" || s == "lv1" || s == "pv1") {
                    ReadFaceVertex(t,tf[0]);
                    has[0] = true;
                }
                else if (s == "fv2" || s == "lv2") {
                    ReadFaceVertex(t,tf[1]);
                    has[1] = true;
                }
                else if (s == "fv3") {
                    ReadFaceVertex(t,tf[2]);
                    has[2] = true;
                }
                else if (s == "mat") {
                    if (mid != ~0u) {
                        LogWarn("only one material tag allowed per <f>");
                    }
                    mid = ResolveMaterialRef(scope);
                }
                else if (s == "matref") {
                    if (mid != ~0u) {
                        LogWarn("only one material tag allowed per <f>");
                    }
                    mid = ResolveMaterialRef(scope);
                }
            }

            if (mid == ~0u) {
                ThrowException("missing material index");
            }

            bool nor = false;
            bool uv = false;
            for(unsigned int i = 0; i < vcount; ++i) {
                if (!has[i]) {
                    ThrowException("missing face vertex data");
                }

                nor = nor || tf[i].has_normal;
                uv = uv || tf[i].has_uv;
            }

            if (mid >= (1<<30)) {
                LogWarn("material indices exhausted, this may cause errors in the output");
            }
            unsigned int meshId = mid | ((nor?1:0)<<31) | ((uv?1:0)<<30);

            TempMaterialMesh& mesh = bymat[meshId];
            mesh.matid = mid;

            for(unsigned int i = 0; i < vcount; ++i) {
                mesh.positions.push_back(tf[i].pos);
                if(nor) {
                    mesh.normals.push_back(tf[i].normal);
                }
                if(uv) {
                    mesh.uvs.push_back(tf[i].uv);
                }

                mesh.pflags |= 1 << (vcount-1);
            }

            mesh.vcounts.push_back(vcount);
        }
    }

    // finally extract output meshes and add them to the scope
    typedef std::pair<unsigned int, TempMaterialMesh> pairt;
    for(const pairt& p : bymat) {
        aiMesh* const m  = ToOutputMesh(p.second);
        scope.meshes_linear.push_back(m);

        // if this is a definition, keep it on the stack
        if(mesh_id != ~0u) {
            scope.meshes.insert(std::pair<unsigned int, aiMesh*>(mesh_id,m));
        }
    }

    // no id == not a reference, insert this mesh right *here*
    return mesh_id == ~0u;
}